

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O1

bool ProcessDifferentials<Blob<256>>
               (vector<Blob<256>,_std::allocator<Blob<256>_>_> *diffs,int reps,bool dumpCollisions)

{
  pointer pBVar1;
  ulong uVar2;
  int iVar3;
  size_t i;
  long lVar4;
  pointer pBVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  Blob<256> kp;
  uint8_t local_50 [32];
  
  pBVar5 = (diffs->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1 = (diffs->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar5 != pBVar1) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Blob<256>*,std::vector<Blob<256>,std::allocator<Blob<256>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pBVar5,pBVar1,(int)LZCOUNT((long)pBVar1 - (long)pBVar5 >> 5) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Blob<256>*,std::vector<Blob<256>,std::allocator<Blob<256>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pBVar5,pBVar1);
  }
  pBVar5 = (diffs->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((diffs->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>)._M_impl.
      super__Vector_impl_data._M_finish == pBVar5) {
    uVar8 = 0;
    bVar11 = true;
  }
  else {
    lVar4 = 0;
    do {
      local_50[lVar4] = pBVar5->bytes[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
    pBVar5 = (diffs->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(diffs->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pBVar5) >> 5) < 2) {
      iVar3 = 1;
      uVar8 = 0;
      bVar11 = true;
    }
    else {
      bVar11 = true;
      uVar8 = 0;
      iVar3 = 1;
      lVar9 = 1;
      lVar4 = 0x21;
      lVar10 = 0x20;
      do {
        if (pBVar5[lVar9].bytes[0] == local_50[0]) {
          uVar2 = 0;
          do {
            uVar7 = uVar2;
            if (uVar7 == 0x1f) break;
            uVar2 = uVar7 + 1;
          } while (pBVar5->bytes[uVar7 + lVar4] == local_50[uVar7 + 1]);
          if (uVar7 < 0x1f) goto LAB_00123834;
          iVar3 = iVar3 + 1;
        }
        else {
LAB_00123834:
          if (iVar3 < 2) {
            uVar8 = uVar8 + 1;
          }
          else {
            if (dumpCollisions) {
              printbits(local_50,0x20);
              printf(" - %4.2f%%\n",((double)iVar3 / (double)reps) * 100.0);
            }
            bVar11 = false;
          }
          pBVar5 = (diffs->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar6 = 0;
          do {
            local_50[lVar6] = pBVar5->bytes[lVar6 + lVar10];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x20);
          iVar3 = 1;
        }
        lVar9 = lVar9 + 1;
        pBVar5 = (diffs->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar4 = lVar4 + 0x20;
        lVar10 = lVar10 + 0x20;
      } while (lVar9 < (int)((ulong)((long)(diffs->
                                           super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pBVar5) >> 5));
    }
    if (iVar3 < 2) {
      uVar8 = uVar8 + 1;
    }
    else if (dumpCollisions) {
      printbits(local_50,0x20);
      printf(" - %4.2f%%\n",((double)iVar3 / (double)reps) * 100.0);
    }
  }
  printf("%d total collisions, of which %d single collisions were ignored",
         (ulong)((long)(diffs->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(diffs->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>)._M_impl.
                      super__Vector_impl_data._M_start) >> 5,(ulong)uVar8);
  if (!bVar11) {
    printf(" !!!!!");
  }
  puts("\n");
  return bVar11;
}

Assistant:

bool ProcessDifferentials ( std::vector<keytype> & diffs, int reps, bool dumpCollisions )
{
  std::sort(diffs.begin(), diffs.end());

  int count = 1;
  int ignore = 0;

  bool result = true;

  if(diffs.size())
  {
    keytype kp = diffs[0];

    for(int i = 1; i < (int)diffs.size(); i++)
    {
      if(diffs[i] == kp)
      {
        count++;
        continue;
      }
      else
      {
        if(count > 1)
        {
          result = false;

          double pct = 100 * (double(count) / double(reps));

          if(dumpCollisions)
          {
            printbits((unsigned char*)&kp,sizeof(kp));
            printf(" - %4.2f%%\n", pct );
          }
        }
        else 
        {
          ignore++;
        }

        kp = diffs[i];
        count = 1;
      }
    }

    if(count > 1)
    {
      double pct = 100 * (double(count) / double(reps));

      if(dumpCollisions)
      {
        printbits((unsigned char*)&kp,sizeof(kp));
        printf(" - %4.2f%%\n", pct );
      }
    }
    else 
    {
      ignore++;
    }
  }

  printf("%d total collisions, of which %d single collisions were ignored",
         (int)diffs.size(),ignore);

  if(result == false)
  {
    printf(" !!!!!");
  }

  printf("\n\n");

  return result;
}